

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

void __thiscall t_php_generator::generate_service_rest(t_php_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *this_00;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  t_type *type;
  undefined8 *puVar8;
  undefined4 extraout_var_01;
  long *plVar9;
  size_type *psVar10;
  pointer pptVar11;
  pointer pptVar12;
  _Alloc_hider _Var13;
  string req;
  string cast;
  string extends_if;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  string local_b8;
  pointer local_98;
  t_struct *local_90;
  vector<t_function_*,_std::allocator<t_function_*>_> local_88;
  string local_70;
  string local_50;
  
  this_00 = &this->f_service_;
  if (this->classmap_ == false) {
    std::operator+(&local_f8,&this->package_dir_,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_c8 = *plVar9;
      lStack_c0 = plVar6[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar9;
      local_d8 = (long *)*plVar6;
    }
    local_d0 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_f8,(char *)local_d8,(allocator *)&local_118);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_service_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(this_00);
    (this->f_service_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
    field_0x90 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    generate_service_header(this,tservice,(ostream *)this_00);
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
  }
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  if (tservice->extends_ != (t_service *)0x0) {
    php_namespace_abi_cxx11_(&local_158,this,(tservice->extends_->super_t_type).program_);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x395650);
    paVar2 = &local_138.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_138.field_2._M_allocated_capacity = *psVar10;
      local_138.field_2._8_8_ = plVar6[3];
      local_138._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar10;
      local_138._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_138._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    iVar5 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_138,*(ulong *)CONCAT44(extraout_var,iVar5));
    paVar3 = &local_118.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118.field_2._8_8_ = plVar6[3];
      local_118._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    paVar4 = &local_158.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar4) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    php_namespace_abi_cxx11_(&local_b8,this,(tservice->extends_->super_t_type).program_);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x395650);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158.field_2._8_4_ = (undefined4)plVar6[3];
      local_158.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
      local_158._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    iVar5 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_158,*(ulong *)CONCAT44(extraout_var_00,iVar5));
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_138.field_2._M_allocated_capacity = *psVar10;
      local_138.field_2._8_8_ = plVar6[3];
      local_138._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar10;
      local_138._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_138._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118.field_2._8_8_ = plVar6[3];
      local_118._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar3) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar4) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"class ",6);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p
                      ,(this->super_t_oop_generator).super_t_generator.service_name_.
                       _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Rest",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (local_d0 == 0) {
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"protected $impl_;",0x11);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"public function __construct($impl) {",0x24);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  $this->impl_ = $impl;",0x17);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  paVar2 = &local_138.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_88,&tservice->functions_);
  if (local_88.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar11 = local_88.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public function ",0x10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar11)->name_)._M_dataplus._M_p,
                          ((*pptVar11)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"($request) {",0xc);
      _Var13 = ::endl_abi_cxx11_._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      local_90 = (*pptVar11)->arglist_;
      local_98 = pptVar11;
      for (pptVar12 = (local_90->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          pptVar12 !=
          (local_90->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
        type = t_type::get_true_type((*pptVar12)->type_);
        type_to_cast_abi_cxx11_(&local_118,(t_php_generator *)_Var13._M_p,type);
        std::operator+(&local_158,"$request[\'",&(*pptVar12)->name_);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_138.field_2._M_allocated_capacity = *psVar10;
          local_138.field_2._8_8_ = puVar8[3];
          local_138._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar10;
          local_138._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_138._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        iVar5 = (*(type->super_t_doc)._vptr_t_doc[8])(type);
        if ((char)iVar5 == '\0') {
          t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)this_00,local_158._M_dataplus._M_p,
                              local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                              ((*pptVar12)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = isset(",9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ? ",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," : null;",8);
          _Var13 = ::endl_abi_cxx11_._M_dataplus;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        else {
          t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)this_00,local_158._M_dataplus._M_p,
                              local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                              ((*pptVar12)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(!empty(",8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") && (",6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," !== \'false\'));",0xf);
          _Var13 = ::endl_abi_cxx11_._M_dataplus;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        iVar5 = (*(type->super_t_doc)._vptr_t_doc[6])(type);
        if ((((char)iVar5 == '\0') ||
            (*(char *)((long)&type[1].super_t_doc._vptr_t_doc + 4) != '\x01')) ||
           (*(int *)&type[1].super_t_doc._vptr_t_doc != 1)) {
          iVar5 = (*(type->super_t_doc)._vptr_t_doc[0x10])(type);
          if ((char)iVar5 != '\0') {
LAB_002ff731:
            t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)this_00,local_158._M_dataplus._M_p,
                                local_158._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                                ((*pptVar12)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," = json_decode($",0x10);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                                ((*pptVar12)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", true);",8);
            _Var13 = ::endl_abi_cxx11_._M_dataplus;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            goto LAB_002ff7d1;
          }
          iVar5 = (*(type->super_t_doc)._vptr_t_doc[0xe])(type);
          if ((char)iVar5 != '\0') goto LAB_002ff731;
          iVar5 = (*(type->super_t_doc)._vptr_t_doc[0xf])(type);
          if ((char)iVar5 != '\0') {
            t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)this_00,local_158._M_dataplus._M_p,
                                local_158._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                                ((*pptVar12)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," = array_fill_keys(json_decode($",0x20);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                                ((*pptVar12)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", true), 1);",0xc);
            _Var13 = ::endl_abi_cxx11_._M_dataplus;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            goto LAB_002ff7d1;
          }
          iVar5 = (*(type->super_t_doc)._vptr_t_doc[0xb])(type);
          if ((char)iVar5 != '\0') {
LAB_002ff8f0:
            t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)this_00,local_158._M_dataplus._M_p,
                                local_158._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if ($",5);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                                ((*pptVar12)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," !== null) {",0xc);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_b8._M_dataplus._M_p,local_b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  $",3);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                                ((*pptVar12)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," = new ",7);
            php_namespace_abi_cxx11_(&local_50,this,type->program_);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
            iVar5 = (*(type->super_t_doc)._vptr_t_doc[3])(type);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,*(char **)CONCAT44(extraout_var_01,iVar5),
                                ((undefined8 *)CONCAT44(extraout_var_01,iVar5))[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(json_decode($",0xe);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                                ((*pptVar12)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", true));",9);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
            _Var13 = ::endl_abi_cxx11_._M_dataplus;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            goto LAB_002ff7d1;
          }
          iVar5 = (*(type->super_t_doc)._vptr_t_doc[0xc])(type);
          if ((char)iVar5 != '\0') goto LAB_002ff8f0;
        }
        else {
          t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)this_00,local_158._M_dataplus._M_p,
                              local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                              ((*pptVar12)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = explode(\',\', $",0x11);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                              ((*pptVar12)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
          _Var13 = ::endl_abi_cxx11_._M_dataplus;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002ff7d1:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,local_118._M_dataplus._M_p,local_118._M_string_length);
      pptVar11 = local_98;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return $this->impl_->",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar11)->name_)._M_dataplus._M_p,
                          ((*pptVar11)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      argument_list_abi_cxx11_(&local_138,this,(*pptVar11)->arglist_,false);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             local_88.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  _Var13 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  if (this->classmap_ == false) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (this_00,(int)_Var13._M_p);
  }
  if (local_88.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

void t_php_generator::generate_service_rest(t_service* tservice) {
  ofstream_with_content_based_conditional_update& f_service_rest = f_service_;
  if (!classmap_) {
    string f_service_rest_name = package_dir_ + service_name_ + "Rest.php";
    f_service_rest.open(f_service_rest_name.c_str());
    generate_service_header(tservice, f_service_rest);
  }

  string extends = "";
  string extends_if = "";
  if (tservice->get_extends() != nullptr) {
    extends = " extends " + php_namespace(tservice->get_extends()->get_program())
              + tservice->get_extends()->get_name();
    extends_if = " extends " + php_namespace(tservice->get_extends()->get_program())
                 + tservice->get_extends()->get_name() + "Rest";
  }
  f_service_rest << "class " << service_name_ << "Rest" << extends_if << endl
                 << "{" << endl;
  indent_up();

  if (extends.empty()) {
    f_service_rest << indent() << "protected $impl_;" << endl << endl;
  }

  f_service_rest << indent() << "public function __construct($impl) {" << endl << indent()
             << "  $this->impl_ = $impl;" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_service_rest) << "public function " << (*f_iter)->get_name() << "($request) {" << endl;
    indent_up();
    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator a_iter;
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      t_type* atype = get_true_type((*a_iter)->get_type());
      string cast = type_to_cast(atype);
      string req = "$request['" + (*a_iter)->get_name() + "']";
      if (atype->is_bool()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = " << cast << "(!empty(" << req
                   << ") && (" << req << " !== 'false'));" << endl;
      } else {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = isset(" << req << ") ? "
                   << cast << req << " : null;" << endl;
      }
      if (atype->is_string() && ((t_base_type*)atype)->is_string_list()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = explode(',', $"
                       << (*a_iter)->get_name() << ");" << endl;
      } else if (atype->is_map() || atype->is_list()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = json_decode($"
                       << (*a_iter)->get_name() << ", true);" << endl;
      } else if (atype->is_set()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = array_fill_keys(json_decode($"
                       << (*a_iter)->get_name() << ", true), 1);" << endl;
      } else if (atype->is_struct() || atype->is_xception()) {
        f_service_rest << indent() << "if ($" << (*a_iter)->get_name() << " !== null) {" << endl
                       << indent() << "  $" << (*a_iter)->get_name() << " = new "
                       << php_namespace(atype->get_program()) << atype->get_name() << "(json_decode($"
                       << (*a_iter)->get_name() << ", true));" << endl << indent() << "}" << endl;
      }
    }
    f_service_rest << indent() << "return $this->impl_->" << (*f_iter)->get_name() << "("
               << argument_list((*f_iter)->get_arglist(), false) << ");" << endl;
    indent_down();
    indent(f_service_rest) << "}" << endl << endl;
  }
  indent_down();
  f_service_rest << "}" << endl << endl;

  // Close service rest file
  f_service_rest << endl;
  if (!classmap_) {
    f_service_rest.close();
  }
}